

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_flbi.c
# Opt level: O0

char * cmime_flbi_boundary_linebreak(char *s,char *linebreak)

{
  char *__src;
  size_t sVar1;
  int len;
  char *p;
  char *out;
  char *linebreak_local;
  char *s_local;
  
  p = (char *)0x0;
  __src = strstr(s,linebreak);
  if (__src != (char *)0x0) {
    sVar1 = strlen(linebreak);
    p = (char *)calloc((long)(int)sVar1 + 1,1);
    strncpy(p,__src,(long)(int)sVar1);
    sVar1 = strlen(p);
    p[sVar1] = '\0';
  }
  return p;
}

Assistant:

char *cmime_flbi_boundary_linebreak(char *s, char *linebreak) {
    char *out = NULL;
    char *p = NULL;
    int len;

    p = strstr(s,linebreak);
    if (p!=NULL) {
        len = strlen(linebreak);
        out = (char *)calloc(len + sizeof(char), sizeof(char));
        strncpy(out,p,len);
        out[strlen(out)] = '\0';
    }

    return(out);   
}